

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool ExpectsContent(Node *node)

{
  Node *node_local;
  
  if (node->type == StartTag) {
    if (node->tag == (Dict *)0x0) {
      node_local._4_4_ = yes;
    }
    else if ((node->tag->model & 1) == 0) {
      node_local._4_4_ = yes;
    }
    else {
      node_local._4_4_ = no;
    }
  }
  else {
    node_local._4_4_ = no;
  }
  return node_local._4_4_;
}

Assistant:

static Bool ExpectsContent(Node *node)
{
    if (node->type != StartTag)
        return no;

    /* unknown element? */
    if (node->tag == NULL)
        return yes;

    if (node->tag->model & CM_EMPTY)
        return no;

    return yes;
}